

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-model-loader.cpp
# Opt level: O0

bool __thiscall
llama_model_loader::get_key<llama_pooling_type>
          (llama_model_loader *this,llm_kv kid,llama_pooling_type *result,bool required)

{
  bool bVar1;
  undefined4 *in_RDX;
  bool found;
  uint32_t tmp;
  llm_kv in_stack_0000002c;
  llama_model_loader *in_stack_00000030;
  undefined4 local_20;
  
  bVar1 = get_key<unsigned_int>(in_stack_00000030,in_stack_0000002c,(uint *)this,(bool)kid._3_1_);
  if (bVar1) {
    *in_RDX = local_20;
  }
  else {
    *in_RDX = 0xffffffff;
  }
  return bVar1;
}

Assistant:

bool llama_model_loader::get_key(enum llm_kv kid, enum llama_pooling_type & result, bool required) {
        uint32_t tmp;
        const bool found = get_key(kid, tmp, required);
        if (found) {
            result = (enum llama_pooling_type) tmp;
        } else {
            result = LLAMA_POOLING_TYPE_UNSPECIFIED;
        }
        return found;
    }